

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::CopyImage::FunctionalTest::copyAndVerify
          (FunctionalTest *this,testCase *test_case,GLubyte **dst_pixels,GLubyte **src_pixels)

{
  ostringstream *poVar1;
  GLenum GVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  TestError *this_00;
  uint uVar6;
  uint uVar7;
  byte bVar8;
  uint uVar9;
  undefined8 uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  bool bVar14;
  bool bVar15;
  Enum<int,_2UL> local_1f0;
  Enum<int,_2UL> local_1e0;
  Enum<int,_2UL> local_1d0;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar5;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  GVar2 = (test_case->m_dst).m_target;
  bVar8 = 0;
  if ((int)GVar2 < 0x8c1a) {
    if ((GVar2 == 0x806f) || (GVar2 == 0x8c18)) goto LAB_00870b82;
  }
  else if ((GVar2 == 0x8c1a) || ((GVar2 == 0x9102 || (GVar2 == 0x9009)))) {
LAB_00870b82:
    bVar8 = 1;
  }
  GVar2 = (test_case->m_src).m_target;
  if ((int)GVar2 < 0x8c1a) {
    if ((GVar2 == 0x806f) || (GVar2 == 0x8c18)) goto LAB_00870bba;
LAB_00870bce:
    if (bVar8 == 0) {
      uVar10 = 1;
LAB_00870bca:
      uVar9 = 0;
      uVar11 = 1;
      uVar6 = 0;
      goto LAB_00870be9;
    }
  }
  else {
    if ((GVar2 != 0x8c1a) && ((GVar2 != 0x9009 && (GVar2 != 0x9102)))) goto LAB_00870bce;
LAB_00870bba:
    if (bVar8 != 0) {
      uVar10 = 0xc;
      goto LAB_00870bca;
    }
  }
  uVar6 = (uint)bVar8;
  uVar9 = (uint)(bVar8 ^ 1);
  uVar11 = 0xc;
  uVar10 = 1;
LAB_00870be9:
  uVar12 = 0;
  uVar13 = 0;
  bVar14 = false;
  uVar7 = 1;
  while( true ) {
    if (this->m_rb_name == 0) {
      (**(code **)(lVar5 + 0x310))
                (this->m_src_tex_name,(test_case->m_src).m_target,(test_case->m_src).m_level,
                 test_case->m_src_x,test_case->m_src_y,uVar13,this->m_dst_tex_name,
                 (test_case->m_dst).m_target,(test_case->m_dst).m_level,test_case->m_dst_x,
                 test_case->m_dst_y,uVar12,test_case->m_width,test_case->m_height,uVar10);
    }
    else {
      (**(code **)(lVar5 + 0x310))(this->m_src_tex_name,0xde1);
      (**(code **)(lVar5 + 0x310))
                (this->m_rb_name,(test_case->m_src).m_target,(test_case->m_src).m_level,
                 test_case->m_src_x,test_case->m_src_y,uVar13 & 0xffffffff,this->m_dst_tex_name,
                 (test_case->m_dst).m_target,(test_case->m_dst).m_level,test_case->m_dst_x,
                 test_case->m_dst_y,uVar12,test_case->m_width,test_case->m_height,uVar10);
    }
    iVar3 = (**(code **)(lVar5 + 0x800))();
    if ((iVar3 != 0) ||
       (iVar4 = verify(this,(EVP_PKEY_CTX *)test_case,(uchar *)(uVar12 & 0xffffffff),
                       (size_t)dst_pixels,(uchar *)(uVar13 & 0xffffffff),(size_t)src_pixels),
       (char)iVar4 == '\0')) break;
    bVar14 = uVar11 <= uVar7;
    uVar13 = uVar13 + uVar9;
    uVar12 = uVar12 + uVar6;
    bVar15 = uVar7 == uVar11;
    uVar7 = uVar7 + 1;
    if (bVar15) {
      return true;
    }
  }
  local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Failure. Targets src: ",0x16);
  local_1f0.m_value = (test_case->m_src).m_target;
  local_1f0.m_getName = glu::getTextureTargetName;
  tcu::Format::Enum<int,_2UL>::toStream(&local_1f0,(ostream *)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", dst: ",7);
  local_1c0.m_value = (test_case->m_dst).m_target;
  local_1c0.m_getName = glu::getTextureTargetName;
  tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,". Levels src: ",0xe);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", dst: ",7);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,". Dimmensions src [",0x13);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"], dst [",8);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]. Region [",0xb);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," x ",3);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," x ",3);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"] from [",8);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"] to [",6);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]. Format src: ",0xf);
  local_1d0.m_value = (test_case->m_src).m_internal_format;
  local_1d0.m_getName = glu::getInternalFormatParameterName;
  tcu::Format::Enum<int,_2UL>::toStream(&local_1d0,(ostream *)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", dst: ",7);
  local_1e0.m_value = (test_case->m_dst).m_internal_format;
  local_1e0.m_getName = glu::getInternalFormatParameterName;
  tcu::Format::Enum<int,_2UL>::toStream(&local_1e0,(ostream *)poVar1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  if (iVar3 == 0) {
    return bVar14;
  }
  local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Failed due to error: ",0x15)
  ;
  local_1f0.m_getName = glu::getErrorName;
  local_1f0.m_value = iVar3;
  tcu::Format::Enum<int,_2UL>::toStream(&local_1f0,(ostream *)poVar1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Copy operation failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
             ,0xb7f);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

bool FunctionalTest::copyAndVerify(const testCase& test_case, const GLubyte** dst_pixels, const GLubyte** src_pixels)
{
	GLenum			 error				= GL_NO_ERROR;
	const Functions& gl					= m_context.getRenderContext().getFunctions();
	GLuint			 region_depth		= 1;
	GLuint			 dst_layer_step		= 0;
	const bool		 is_dst_multi_layer = Utils::isTargetMultilayer(test_case.m_dst.m_target);
	const bool		 is_src_multi_layer = Utils::isTargetMultilayer(test_case.m_src.m_target);
	bool			 result				= false;
	GLuint			 src_layer_step		= 0;
	GLuint			 n_layers			= 1;

	/* Configure layers */
	if ((true == is_dst_multi_layer) || (true == is_src_multi_layer))
	{
		if (is_src_multi_layer == is_dst_multi_layer)
		{
			/* Both objects are multilayered, copy all layers at once, verify at once */
			region_depth = FUNCTIONAL_TEST_N_LAYERS;
		}
		else if (true == is_dst_multi_layer)
		{
			/* Destination is multilayered, copy each layer separetly, verify at once */
			n_layers	   = FUNCTIONAL_TEST_N_LAYERS;
			dst_layer_step = 1;
		}
		else
		{
			/* Destination is multilayered, copy and verify each layer separetly */
			n_layers	   = FUNCTIONAL_TEST_N_LAYERS;
			src_layer_step = 1;
		}
	}

	/* Copy and verification */
	{
		GLuint dst_layer = 0;
		GLuint src_layer = 0;

		/* For each layer */
		for (GLuint layer = 0; layer < n_layers; ++layer)
		{
			if (0 == m_rb_name)
			{
				gl.copyImageSubData(m_src_tex_name, test_case.m_src.m_target, test_case.m_src.m_level,
									test_case.m_src_x, test_case.m_src_y, src_layer, m_dst_tex_name,
									test_case.m_dst.m_target, test_case.m_dst.m_level, test_case.m_dst_x,
									test_case.m_dst_y, dst_layer, test_case.m_width, test_case.m_height, region_depth);
			}
			else /* Copy from src to rb and from rb to dst */
			{
				/* Src and rb shares differs only on target */
				gl.copyImageSubData(m_src_tex_name, GL_TEXTURE_2D, test_case.m_src.m_level, test_case.m_src_x,
									test_case.m_src_y, src_layer, m_rb_name, test_case.m_src.m_target,
									test_case.m_src.m_level, test_case.m_src_x, test_case.m_src_y, src_layer,
									test_case.m_width, test_case.m_height, region_depth);

				gl.copyImageSubData(m_rb_name, test_case.m_src.m_target, test_case.m_src.m_level, test_case.m_src_x,
									test_case.m_src_y, src_layer, m_dst_tex_name, test_case.m_dst.m_target,
									test_case.m_dst.m_level, test_case.m_dst_x, test_case.m_dst_y, dst_layer,
									test_case.m_width, test_case.m_height, region_depth);
			}

			/* Verify generated error */
			error = gl.getError();

			if (GL_NO_ERROR == error)
			{
				/* Verify copy results */
				result = verify(test_case, dst_layer, dst_pixels, src_layer, src_pixels, region_depth);
			}

			if ((GL_NO_ERROR != error) || (false == result))
			{
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message
					<< "Failure. Targets src: " << glu::getTextureTargetStr(test_case.m_src.m_target)
					<< ", dst: " << glu::getTextureTargetStr(test_case.m_dst.m_target)
					<< ". Levels src: " << test_case.m_src.m_level << ", dst: " << test_case.m_dst.m_level
					<< ". Dimmensions src [" << test_case.m_src.m_width << ", " << test_case.m_src.m_height
					<< "], dst [" << test_case.m_dst.m_width << ", " << test_case.m_dst.m_height << "]. Region ["
					<< test_case.m_width << " x " << test_case.m_height << " x " << region_depth << "] from ["
					<< test_case.m_src_x << ", " << test_case.m_src_y << ", " << src_layer << "] to ["
					<< test_case.m_dst_x << ", " << test_case.m_dst_y << ", " << dst_layer
					<< "]. Format src: " << glu::getInternalFormatParameterStr(test_case.m_src.m_internal_format)
					<< ", dst: " << glu::getInternalFormatParameterStr(test_case.m_dst.m_internal_format)
					<< tcu::TestLog::EndMessage;

				if (GL_NO_ERROR != error)
				{
					m_context.getTestContext().getLog() << tcu::TestLog::Message
														<< "Failed due to error: " << glu::getErrorStr(error)
														<< tcu::TestLog::EndMessage;

					TCU_FAIL("Copy operation failed");
				}

				return false;
			}

			/* Step one layer */
			dst_layer += dst_layer_step;
			src_layer += src_layer_step;
		}
	}

	return true;
}